

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * QString::trimmed_helper(QString *__return_storage_ptr__,QString *str)

{
  QStringAlgorithms<QString>::trimmed_helper(__return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

QString QString::trimmed_helper(QString &str)
{
    return QStringAlgorithms<QString>::trimmed_helper(str);
}